

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

GRULayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gru(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x19a) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x19a;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x88);
    GRULayerParams::GRULayerParams(this_00.gru_);
    (this->layer_).gru_ = (GRULayerParams *)this_00;
  }
  return (GRULayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GRULayerParams* NeuralNetworkLayer::mutable_gru() {
  if (!has_gru()) {
    clear_layer();
    set_has_gru();
    layer_.gru_ = new ::CoreML::Specification::GRULayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gru)
  return layer_.gru_;
}